

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<ParamsStream<DataStream&,CAddress::SerParams>,16u,unsigned_char>
               (ParamsStream<DataStream_&,_CAddress::SerParams> *os,
               prevector<16U,_unsigned_char,_unsigned_int,_int> *v)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar4;
  
  sVar2 = *(size_t *)(in_FS_OFFSET + 0x28);
  uVar1 = v->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  WriteCompactSize<ParamsStream<DataStream&,CAddress::SerParams>>(os,(ulong)uVar3);
  uVar1 = v->_size;
  uVar3 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0) {
    if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
      return;
    }
  }
  else {
    SVar4 = MakeByteSpan<prevector<16u,unsigned_char,unsigned_int,int>const&>(v);
    if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar2) {
      ParamsStream<DataStream_&,_CAddress::SerParams>::write
                (os,(int)SVar4.m_data,(void *)SVar4.m_size,*(size_t *)(in_FS_OFFSET + 0x28));
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}